

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_create_array(JSContext *ctx,int len,JSValue *tab)

{
  JSValue this_obj;
  JSValue JVar1;
  int iVar2;
  int iVar3;
  JSValueUnion JVar4;
  long in_RDX;
  int in_ESI;
  JSContext *in_RDI;
  JSValue JVar5;
  JSValue JVar6;
  int i;
  JSValue obj;
  JSContext *in_stack_ffffffffffffff90;
  JSContext *ctx_00;
  JSValueUnion JVar7;
  JSValueUnion ctx_01;
  int64_t iVar8;
  undefined4 in_stack_ffffffffffffffc0;
  JSValueUnion JVar9;
  undefined4 local_10;
  undefined4 uStack_c;
  undefined8 local_8;
  
  JVar5 = JS_NewArray(in_stack_ffffffffffffff90);
  ctx_01 = JVar5.u;
  iVar8 = JVar5.tag;
  JVar9 = ctx_01;
  local_8 = iVar8;
  iVar2 = JS_IsException(JVar5);
  if (iVar2 == 0) {
    for (iVar2 = 0; iVar2 < in_ESI; iVar2 = iVar2 + 1) {
      JVar4 = (JSValueUnion)(long)iVar2;
      ctx_00 = in_RDI;
      JVar6 = JS_DupValue(in_RDI,*(JSValue *)(in_RDX + (long)iVar2 * 0x10));
      JVar7 = JVar6.u;
      this_obj.tag = local_8;
      this_obj.u.float64 = JVar9.float64;
      JVar5.tag._0_4_ = in_stack_ffffffffffffffc0;
      JVar5.u = (JSValueUnion)iVar8;
      JVar5.tag._4_4_ = iVar2;
      iVar3 = JS_CreateDataPropertyUint32
                        ((JSContext *)ctx_01.ptr,this_obj,JVar6.tag,JVar5,obj.u.int32);
      if (iVar3 < 0) {
        JVar6.tag = (int64_t)JVar7.ptr;
        JVar6.u.float64 = JVar4.float64;
        JS_FreeValue(ctx_00,JVar6);
        local_10 = 0;
        local_8 = 6;
        goto LAB_00167a58;
      }
    }
    local_10 = JVar9.int32;
    uStack_c = JVar9._4_4_;
  }
  else {
    local_10 = 0;
    local_8 = 6;
  }
LAB_00167a58:
  JVar1.u._4_4_ = uStack_c;
  JVar1.u.int32 = local_10;
  JVar1.tag = local_8;
  return JVar1;
}

Assistant:

static JSValue js_create_array(JSContext *ctx, int len, JSValueConst *tab)
{
    JSValue obj;
    int i;

    obj = JS_NewArray(ctx);
    if (JS_IsException(obj))
        return JS_EXCEPTION;
    for(i = 0; i < len; i++) {
        if (JS_CreateDataPropertyUint32(ctx, obj, i, JS_DupValue(ctx, tab[i]), 0) < 0) {
            JS_FreeValue(ctx, obj);
            return JS_EXCEPTION;
        }
    }
    return obj;
}